

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_expmod.c
# Opt level: O3

int main(void)

{
  uint64_t uVar1;
  
  uVar1 = expmod(0x1b0,0x12,0x2fd);
  if (((uVar1 == 0x2d9) &&
      (uVar1 = expmod(0x16fee0e688,0x4f84cd631,0x462d52e7cbcb8), uVar1 == 0x1e3ca43954aa8)) &&
     (uVar1 = expmod(0x112210bd97522c18,0x84b603a249dbac18,0x40000011d255120d),
     uVar1 == 0x3a67a22ee50e7883)) {
    return 0;
  }
  return 1;
}

Assistant:

int main() {

    // test with small numbers

    if(expmod(432, 18, 765) != 729)
        goto error;

    if(expmod(98765432456, 21345654321, 1234567654325432) != 531932833467048)
        goto error;

    // test with big numbers

    if(expmod(1234567654326545432, 0x84b603a249dbac18, 4611686094970622477) != 4208510699096144003)
        goto error;

    return 0;


    error:
        return 1;

}